

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv4Transmitter::GetLocalHostName
          (RTPUDPv4Transmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  uint uVar1;
  _List_node_base *p_Var2;
  RTPMemoryManager *pRVar3;
  bool bVar4;
  _List_node_base **pp_Var5;
  _Alloc_hider _Var6;
  size_type sVar7;
  int iVar8;
  int iVar9;
  _List_node_base *p_Var10;
  hostent *phVar11;
  _Node *p_Var12;
  long lVar13;
  uint8_t *puVar14;
  size_t sVar15;
  undefined1 *puVar16;
  ulong uVar17;
  _List_node_base *p_Var18;
  bool bVar19;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  string hname_1;
  uint8_t addr [4];
  string hname;
  allocator<char> local_c5;
  uint local_c4;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  _List_node_base *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  uint local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  RTPUDPv4Transmitter *local_50;
  uint8_t *local_48;
  ulong *local_40;
  _List_node_base *local_38;
  
  if (this->init != true) {
    return -0x5a;
  }
  if (this->created != true) {
    return -0x59;
  }
  if (this->localhostname == (uint8_t *)0x0) {
    local_38 = (_List_node_base *)&this->localIPs;
    local_a8 = (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl._M_node.super__List_node_base._M_next;
    if (local_a8 == local_38) {
      return -0x55;
    }
    p_Var10 = (_List_node_base *)&local_c0;
    local_c0._M_impl._M_node._M_size = 0;
    local_c0._M_impl._M_node.super__List_node_base._M_next = p_Var10;
    local_c0._M_impl._M_node.super__List_node_base._M_prev = p_Var10;
    local_50 = this;
    local_48 = buffer;
    local_40 = bufferlength;
    do {
      local_c4 = (uint)CONCAT71((int7)((ulong)p_Var10 >> 8),1);
      bVar19 = false;
      do {
        uVar1 = *(uint *)&local_a8[1]._M_next;
        local_7c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        phVar11 = gethostbyaddr(&local_7c,4,2);
        if (phVar11 == (hostent *)0x0) {
          local_c4 = 0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,phVar11->h_name,(allocator<char> *)&local_a0);
          sVar7 = local_78._M_string_length;
          _Var6._M_p = local_78._M_dataplus._M_p;
          if (!bVar19) {
            p_Var10 = local_c0._M_impl._M_node.super__List_node_base._M_next;
            bVar4 = bVar19;
            if (local_c0._M_impl._M_node.super__List_node_base._M_next !=
                (_List_node_base *)&local_c0) {
              do {
                p_Var18 = p_Var10[1]._M_prev;
                bVar19 = bVar4;
                if (p_Var18 == (_List_node_base *)sVar7) {
                  if (p_Var18 == (_List_node_base *)0x0) {
                    bVar19 = true;
                  }
                  else {
                    iVar8 = bcmp(p_Var10[1]._M_next,_Var6._M_p,(size_t)p_Var18);
                    bVar19 = true;
                    if (iVar8 != 0) {
                      bVar19 = bVar4;
                    }
                  }
                }
                if (bVar19) goto LAB_00121e49;
                pp_Var5 = &p_Var10->_M_next;
                p_Var10 = *pp_Var5;
                bVar4 = bVar19;
              } while (*pp_Var5 != (_List_node_base *)&local_c0);
            }
            if (!bVar19) {
              p_Var12 = std::__cxx11::
                        list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        _M_create_node<std::__cxx11::string_const&>
                                  ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&local_c0,&local_78);
              std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
              local_c0._M_impl._M_node._M_size = local_c0._M_impl._M_node._M_size + 1;
            }
          }
LAB_00121e49:
          if (!bVar19) {
            iVar8 = 0;
            do {
              if (phVar11->h_aliases[iVar8] == (char *)0x0) break;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a0,phVar11->h_aliases[iVar8],&local_c5);
              sVar7 = local_a0._M_string_length;
              _Var6._M_p = local_a0._M_dataplus._M_p;
              if (!bVar19) {
                p_Var10 = local_c0._M_impl._M_node.super__List_node_base._M_next;
                bVar4 = bVar19;
                if (local_c0._M_impl._M_node.super__List_node_base._M_next !=
                    (_List_node_base *)&local_c0) {
                  do {
                    p_Var18 = p_Var10[1]._M_prev;
                    bVar19 = bVar4;
                    if (p_Var18 == (_List_node_base *)sVar7) {
                      if (p_Var18 == (_List_node_base *)0x0) {
                        bVar19 = true;
                      }
                      else {
                        iVar9 = bcmp(p_Var10[1]._M_next,_Var6._M_p,(size_t)p_Var18);
                        bVar19 = true;
                        if (iVar9 != 0) {
                          bVar19 = bVar4;
                        }
                      }
                    }
                    if (bVar19) goto LAB_00121f25;
                    p_Var10 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base.
                              _M_next;
                    bVar4 = bVar19;
                  } while (p_Var10 != (_List_node_base *)&local_c0);
                }
                if (!bVar19) {
                  p_Var12 = std::__cxx11::
                            list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            _M_create_node<std::__cxx11::string_const&>
                                      ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&local_c0,&local_a0);
                  std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
                  local_c0._M_impl._M_node._M_size = local_c0._M_impl._M_node._M_size + 1;
                  iVar8 = iVar8 + 1;
                }
              }
LAB_00121f25:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
            } while (!bVar19);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
      } while ((!bVar19) && ((local_c4 & 1) != 0));
      p_Var10 = local_a8->_M_next;
      local_a8 = p_Var10;
    } while (p_Var10 != local_38);
    if (local_c0._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_c0) {
      bVar4 = false;
      this = local_50;
    }
    else {
      p_Var10 = (_List_node_base *)&local_c0;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::sort((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)p_Var10);
      this = local_50;
      bVar19 = local_c0._M_impl._M_node.super__List_node_base._M_next == p_Var10;
      if (bVar19) {
        bVar4 = false;
      }
      else {
        bVar4 = false;
        p_Var18 = local_c0._M_impl._M_node.super__List_node_base._M_next;
        do {
          lVar13 = std::__cxx11::string::find((char)(p_Var18 + 1),0x2e);
          if (lVar13 != -1) {
            p_Var2 = p_Var18[1]._M_prev;
            this->localhostnamelength = (size_t)p_Var2;
            puVar16 = (undefined1 *)((long)&p_Var2->_M_next + 1);
            pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
            if (pRVar3 == (RTPMemoryManager *)0x0) {
              puVar14 = (uint8_t *)operator_new__((ulong)puVar16);
            }
            else {
              puVar14 = (uint8_t *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,puVar16,0);
            }
            this->localhostname = puVar14;
            if (puVar14 == (uint8_t *)0x0) {
              bVar4 = true;
              break;
            }
            memcpy(puVar14,p_Var18[1]._M_next,this->localhostnamelength);
            this->localhostname[this->localhostnamelength] = '\0';
            bVar4 = true;
          }
          p_Var18 = p_Var18->_M_next;
          bVar19 = (bool)(p_Var18 == p_Var10 | bVar4);
        } while (!(bool)(p_Var18 == p_Var10 | bVar4));
      }
      if (!bVar19) goto LAB_0012212d;
    }
    bufferlength = local_40;
    buffer = local_48;
    if (!bVar4) {
      uVar1 = *(uint *)&(this->localIPs).
                        super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        _M_node.super__List_node_base._M_next[1]._M_next;
      snprintf((char *)&local_78,0x10,"%d.%d.%d.%d",(ulong)(uVar1 >> 0x18),
               (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
      sVar15 = strlen((char *)&local_78);
      this->localhostnamelength = (long)(int)sVar15;
      uVar17 = (long)(int)sVar15 + 1;
      pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar3 == (RTPMemoryManager *)0x0) {
        puVar14 = (uint8_t *)operator_new__(uVar17);
      }
      else {
        puVar14 = (uint8_t *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,uVar17,0);
      }
      this->localhostname = puVar14;
      if (puVar14 == (uint8_t *)0x0) {
LAB_0012212d:
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear(&local_c0);
        return -1;
      }
      memcpy(puVar14,&local_78,this->localhostnamelength);
      this->localhostname[this->localhostnamelength] = '\0';
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_c0);
  }
  uVar17 = this->localhostnamelength;
  if (*bufferlength < uVar17) {
    *bufferlength = uVar17;
    iVar8 = -0x45;
  }
  else {
    memcpy(buffer,this->localhostname,uVar17);
    *bufferlength = this->localhostnamelength;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int RTPUDPv4Transmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV4TRANS_NOLOCALIPS;
		}
		
		std::list<uint32_t>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			bool founddouble = false;
			bool foundentry = true;

			while (!founddouble && foundentry)
			{
				struct hostent *he;
				uint8_t addr[4];
				uint32_t ip = (*it);
		
				addr[0] = (uint8_t)((ip>>24)&0xFF);
				addr[1] = (uint8_t)((ip>>16)&0xFF);
				addr[2] = (uint8_t)((ip>>8)&0xFF);
				addr[3] = (uint8_t)(ip&0xFF);
				he = gethostbyaddr((char *)addr,4,AF_INET);
				if (he != 0)
				{
					std::string hname = std::string(he->h_name);
					std::list<std::string>::const_iterator it;

					for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
						if ((*it) == hname)
							founddouble = true;

					if (!founddouble)
						hostnames.push_back(hname);
					
					int i = 0;
					while (!founddouble && he->h_aliases[i] != 0)
					{
						std::string hname = std::string(he->h_aliases[i]);
					
						for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
							if ((*it) == hname)
								founddouble = true;

						if (!founddouble)
						{
							hostnames.push_back(hname);
							i++;
						}
					}
				}
				else
					foundentry = false;
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
		
			hostnames.sort();
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			uint32_t ip;
			int len;
			char str[16];
			
			it = localIPs.begin();
			ip = (*it);
			
			RTP_SNPRINTF(str,16,"%d.%d.%d.%d",(int)((ip>>24)&0xFF),(int)((ip>>16)&0xFF),(int)((ip>>8)&0xFF),(int)(ip&0xFF));
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength + 1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}